

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O2

int Ifn_NtkParseInt2(char *pStr,Ifn_Ntk_t *p)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  char *pcVar10;
  int *piVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  char cVar17;
  uint uVar18;
  
  iVar5 = Ifn_ManStrCheck2(pStr,&p->nInps,&p->nObjs);
  if (iVar5 == 0) {
    iVar5 = 0;
  }
  else {
    uVar12 = p->nInps;
    uVar9 = (ulong)uVar12;
    if ((int)uVar12 < 0xc) {
      if ((((int)uVar12 < 2) || (iVar2 = p->nObjs, iVar2 <= (int)uVar12)) || (0x15 < iVar2)) {
        __assert_fail("p->nInps > 1 && p->nInps < p->nObjs && p->nInps <= IFN_INS && p->nObjs < 2*IFN_INS"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                      ,0x181,"int Ifn_NtkParseInt2(char *, Ifn_Ntk_t *)");
      }
      piVar11 = p->Nodes[uVar9].Fanins;
      iVar5 = 1;
      for (; iVar8 = (int)uVar9, iVar8 < iVar2; uVar9 = uVar9 + 1) {
        uVar6 = 3;
        lVar15 = 0;
        pcVar10 = pStr + 3;
        while( true ) {
          if (pStr[lVar15] == '\0') {
            uVar9 = (ulong)(iVar8 + 0x61);
            pcVar10 = "Cannot find definition of signal \'%c\'.\n";
            goto LAB_00332588;
          }
          if ((uVar9 + 0x61 == (ulong)(uint)(int)pStr[lVar15]) && (pStr[lVar15 + 1] == '=')) break;
          lVar15 = lVar15 + 1;
          pcVar10 = pcVar10 + 1;
          uVar6 = (ulong)((int)uVar6 + 1);
        }
        cVar1 = pStr[lVar15 + 2];
        uVar12 = 3;
        cVar17 = ')';
        if (cVar1 != '(') {
          if (cVar1 == '<') {
            uVar12 = 5;
            cVar17 = '>';
          }
          else if (cVar1 == '{') {
            uVar12 = 6;
            cVar17 = '}';
          }
          else {
            if (cVar1 != '[') {
              uVar9 = (ulong)(iVar8 + 0x61);
              pcVar10 = 
              "Cannot find openning operation symbol in the definition of signal \'%c\'.\n";
              goto LAB_00332588;
            }
            uVar12 = 4;
            cVar17 = ']';
          }
        }
        uVar3 = *(uint *)(p->Nodes + uVar9);
        *(uint *)(p->Nodes + uVar9) = uVar3 & 0xfffffff8 | uVar12;
        uVar16 = 0xf8;
        uVar4 = 0;
        iVar14 = -1;
        do {
          iVar13 = iVar14;
          uVar18 = uVar4;
          cVar1 = *pcVar10;
          uVar16 = uVar16 + 8;
          if (cVar1 == '\0') break;
          pcVar10 = pcVar10 + 1;
          uVar4 = uVar18 + 1;
          iVar14 = iVar13 + 1;
        } while (cVar17 != cVar1);
        if (cVar1 == '\0') {
          uVar9 = (ulong)(iVar8 + 0x61);
          pcVar10 = "Cannot find closing operation symbol in the definition of signal \'%c\'.\n";
LAB_00332588:
          Ifn_ErrorMessage(pcVar10,uVar9);
          return 0;
        }
        if (0xb < iVar13 + 4) {
          uVar9 = (ulong)(iVar8 + 0x61);
          pcVar10 = "Cannot find matching operation symbol in the definition of signal \'%c\'.\n";
          goto LAB_00332588;
        }
        if ((int)uVar18 < 1) {
          uVar18 = 0;
        }
        for (uVar7 = 0; uVar18 != uVar7; uVar7 = uVar7 + 1) {
          if ((pStr[uVar7 + uVar6] < 0x61) ||
             (iVar14 = pStr[uVar7 + uVar6] + -0x61, iVar8 <= iVar14)) {
            uVar6 = (ulong)(iVar8 + 0x61);
            pcVar10 = "Fanin number %d is signal %d is out of range.\n";
            uVar9 = uVar7 & 0xffffffff;
            goto LAB_003323f0;
          }
          piVar11[uVar7] = iVar14;
        }
        *(uint *)(p->Nodes + uVar9) = uVar3 & 0xffffff00 | uVar12 | uVar16 & 0xf8;
        piVar11 = piVar11 + 0xc;
      }
    }
    else {
      pcVar10 = 
      "The number of variables (%d) exceeds predefined limit (%d). Recompile with different value of IFN_INS.\n"
      ;
      uVar6 = 0xb;
LAB_003323f0:
      iVar5 = 0;
      Ifn_ErrorMessage(pcVar10,uVar9,uVar6);
    }
  }
  return iVar5;
}

Assistant:

int Ifn_NtkParseInt2( char * pStr, Ifn_Ntk_t * p )
{
    int i, k, n, f, nFans, iFan;
    if ( !Ifn_ManStrCheck2(pStr, &p->nInps, &p->nObjs) )
        return 0;
    if ( p->nInps > IFN_INS )
        return Ifn_ErrorMessage( "The number of variables (%d) exceeds predefined limit (%d). Recompile with different value of IFN_INS.\n", p->nInps, IFN_INS );
    assert( p->nInps > 1 && p->nInps < p->nObjs && p->nInps <= IFN_INS && p->nObjs < 2*IFN_INS );
    for ( i = p->nInps; i < p->nObjs; i++ )
    {
        char Next = 0;
        for ( k = 0; pStr[k]; k++ )
            if ( pStr[k] == 'a' + i && pStr[k+1] == '=' )
                break;
        if ( pStr[k] == 0 )
            return Ifn_ErrorMessage( "Cannot find definition of signal \'%c\'.\n", 'a' + i );
        if ( pStr[k+2] == '(' )
            p->Nodes[i].Type = IFN_DSD_AND, Next = ')';
        else if ( pStr[k+2] == '[' )
            p->Nodes[i].Type = IFN_DSD_XOR, Next = ']';
        else if ( pStr[k+2] == '<' )
            p->Nodes[i].Type = IFN_DSD_MUX, Next = '>';
        else if ( pStr[k+2] == '{' )
            p->Nodes[i].Type = IFN_DSD_PRIME, Next = '}';
        else 
            return Ifn_ErrorMessage( "Cannot find openning operation symbol in the definition of signal \'%c\'.\n", 'a' + i );
        for ( n = k + 3; pStr[n]; n++ )
            if ( pStr[n] == Next )
                break;
        if ( pStr[n] == 0 )
            return Ifn_ErrorMessage( "Cannot find closing operation symbol in the definition of signal \'%c\'.\n", 'a' + i );
        nFans = n - k - 3;
        if ( nFans > 8 )
            return Ifn_ErrorMessage( "Cannot find matching operation symbol in the definition of signal \'%c\'.\n", 'a' + i );
        for ( f = 0; f < nFans; f++ )
        {
            iFan = pStr[k + 3 + f] - 'a';
            if ( iFan < 0 || iFan >= i )
                return Ifn_ErrorMessage( "Fanin number %d is signal %d is out of range.\n", f, 'a' + i );
            p->Nodes[i].Fanins[f] = iFan;
        }
        p->Nodes[i].nFanins = nFans;
    }
    return 1;
}